

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O0

void __thiscall cmCursesLongMessageForm::HandleInput(cmCursesLongMessageForm *this)

{
  uint uVar1;
  uint uVar2;
  void *in_RCX;
  int p1;
  int p1_00;
  int p1_01;
  int p1_02;
  int type;
  int local_c4;
  char local_98 [4];
  int key;
  char debugMessage [128];
  cmCursesLongMessageForm *this_local;
  
  if ((this->super_cmCursesForm).Form != (FORM *)0x0) {
    while( true ) {
      uVar1 = wgetch(_stdscr);
      type = 0x8cb200;
      sprintf(local_98,"Message widget handling input, key: %d",(ulong)uVar1);
      cmCursesForm::LogMessage(local_98);
      if ((uVar1 == 0x6f) || (uVar1 == 0x65)) break;
      if (uVar1 == 0x102) {
LAB_004245f9:
        form_driver((FORM_conflict *)(this->super_cmCursesForm).Form,0x22a);
      }
      else {
        uVar2 = ctrl((EVP_PKEY_CTX *)0x6e,type,p1,in_RCX);
        if (uVar1 == uVar2) goto LAB_004245f9;
        if (uVar1 == 0x103) {
LAB_00424641:
          form_driver((FORM_conflict *)(this->super_cmCursesForm).Form,0x22b);
        }
        else {
          uVar2 = ctrl((EVP_PKEY_CTX *)0x70,type,p1_00,(void *)(ulong)uVar2);
          if (uVar1 == uVar2) goto LAB_00424641;
          if (uVar1 == 0x152) {
LAB_00424689:
            form_driver((FORM_conflict *)(this->super_cmCursesForm).Form,0x22c);
          }
          else {
            uVar2 = ctrl((EVP_PKEY_CTX *)0x64,type,p1_01,(void *)(ulong)uVar2);
            if (uVar1 == uVar2) goto LAB_00424689;
            if ((uVar1 == 0x153) ||
               (uVar2 = ctrl((EVP_PKEY_CTX *)0x75,type,p1_02,(void *)(ulong)uVar2), uVar1 == uVar2))
            {
              form_driver((FORM_conflict *)(this->super_cmCursesForm).Form,0x22d);
            }
          }
        }
      }
      (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])();
      PrintKeys(this);
      if (_stdscr == 0) {
        local_c4 = -1;
      }
      else {
        local_c4 = *(short *)(_stdscr + 4) + 1;
      }
      in_RCX = (void *)0x1;
      wtouchln(_stdscr,0,local_c4);
      wrefresh(_stdscr);
    }
  }
  return;
}

Assistant:

void cmCursesLongMessageForm::HandleInput()
{
  if (!this->Form)
    {
    return;
    }

  char debugMessage[128];

  for(;;)
    {
    int key = getch();

    sprintf(debugMessage, "Message widget handling input, key: %d", key);
    cmCursesForm::LogMessage(debugMessage);

    // quit
    if ( key == 'o' || key == 'e' )
      {
      break;
      }
    else if ( key == KEY_DOWN || key == ctrl('n') )
      {
      form_driver(this->Form, REQ_SCR_FLINE);
      }
    else if ( key == KEY_UP  || key == ctrl('p') )
      {
      form_driver(this->Form, REQ_SCR_BLINE);
      }
    else if ( key == KEY_NPAGE || key == ctrl('d') )
      {
      form_driver(this->Form, REQ_SCR_FPAGE);
      }
    else if ( key == KEY_PPAGE || key == ctrl('u') )
      {
      form_driver(this->Form, REQ_SCR_BPAGE);
      }

    this->UpdateStatusBar();
    this->PrintKeys();
    touchwin(stdscr);
    wrefresh(stdscr);
    }

}